

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::listtransactions(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe778;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar1;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7b0;
  UniValue *in_stack_ffffffffffffe7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7c0;
  undefined7 in_stack_ffffffffffffe7c8;
  undefined1 in_stack_ffffffffffffe7cf;
  string *in_stack_ffffffffffffe7d0;
  undefined7 in_stack_ffffffffffffe7d8;
  undefined1 in_stack_ffffffffffffe7df;
  undefined4 in_stack_ffffffffffffe7e0;
  Type in_stack_ffffffffffffe7e4;
  string *in_stack_ffffffffffffe7e8;
  undefined4 in_stack_ffffffffffffe7f0;
  Type in_stack_ffffffffffffe7f4;
  undefined4 in_stack_ffffffffffffe7f8;
  Type in_stack_ffffffffffffe7fc;
  RPCResult *in_stack_ffffffffffffe800;
  undefined1 *local_17c0;
  undefined1 *local_17a8;
  undefined1 *local_1790;
  undefined1 *local_1778;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_1500 [33];
  allocator<char> local_14df;
  allocator<char> local_14de;
  allocator<char> local_14dd;
  allocator<char> local_14dc;
  undefined1 local_14db [2];
  undefined1 local_14d9 [9];
  pointer pRStack_14d0;
  undefined8 local_14c8;
  undefined1 local_14b2;
  undefined1 local_14b1 [89];
  size_type local_1458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1450;
  allocator<char> local_143a;
  allocator<char> local_1439;
  _Alloc_hider local_1438;
  size_type sStack_1430;
  undefined1 local_1428 [15];
  allocator<char> local_1419;
  pointer local_1418;
  undefined8 uStack_1410;
  pointer local_1408;
  allocator<char> local_13f9;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  allocator<char> local_13ba;
  allocator<char> local_13b9;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  allocator<char> local_1392;
  allocator<char> local_1391 [79];
  allocator<char> local_1342;
  allocator<char> local_1341 [31];
  allocator<char> local_1322;
  allocator<char> local_1321 [28];
  undefined1 local_1305 [2];
  allocator<char> local_1303;
  allocator<char> local_1302;
  allocator<char> local_1301 [7];
  allocator<char> local_12fa;
  allocator<char> local_12f9;
  undefined4 local_12f8;
  allocator<char> local_12f2;
  allocator<char> local_12f1;
  undefined4 local_12f0;
  allocator<char> local_12e9 [31];
  allocator<char> local_12ca;
  allocator<char> local_12c9 [545];
  undefined1 local_10a8 [136];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined1 local_e20 [952];
  undefined1 local_a68 [64];
  undefined1 local_a28 [136];
  undefined1 local_9a0 [200];
  undefined1 local_8d8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined1 local_898;
  undefined1 local_897;
  undefined1 local_7d0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined1 local_790;
  undefined1 local_78f;
  undefined1 local_690;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined1 local_650;
  undefined1 local_64f;
  undefined1 local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_468 [1056];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_12f0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe788,&in_stack_ffffffffffffe780->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_550 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe790);
  local_528 = 0;
  uStack_520 = 0;
  local_518 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe778);
  local_510 = 0;
  local_50f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                 in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
                 in_stack_ffffffffffffe7d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_12f8 = 10;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe7b8,(int *)in_stack_ffffffffffffe7b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_690 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe790);
  local_668 = 0;
  uStack_660 = 0;
  local_658 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe778);
  local_650 = 0;
  local_64f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                 in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
                 in_stack_ffffffffffffe7d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_1301[1] = (allocator<char>)0x0;
  local_1301[2] = (allocator<char>)0x0;
  local_1301[3] = (allocator<char>)0x0;
  local_1301[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe7b8,(int *)in_stack_ffffffffffffe7b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_7d0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe790);
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_798 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe778);
  local_790 = 0;
  local_78f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                 in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
                 in_stack_ffffffffffffe7d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_8d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe790);
  local_8b0 = 0;
  uStack_8a8 = 0;
  local_8a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe778);
  local_898 = 0;
  local_897 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                 in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
                 in_stack_ffffffffffffe7d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8));
  fun = (RPCMethodImpl *)local_1305;
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe778);
  __l._M_len._0_7_ = in_stack_ffffffffffffe7c8;
  __l._M_array = (iterator)in_stack_ffffffffffffe7c0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe7cf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe7b8,__l,
             (allocator_type *)in_stack_ffffffffffffe7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_13b8 = 0;
  uStack_13b0 = 0;
  local_13a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe778);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffe778 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
             in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7e8,
             SUB41(in_stack_ffffffffffffe7e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7d0,
             (bool)in_stack_ffffffffffffe7cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
             in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7e8,
             SUB41(in_stack_ffffffffffffe7e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7d0,
             (bool)in_stack_ffffffffffffe7cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_13f8 = 0;
  uStack_13f0 = 0;
  local_13e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
                 in_stack_ffffffffffffe7c0);
  std::operator+(in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
  local_1418 = (pointer)0x0;
  uStack_1410 = 0;
  local_1408 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_1438._M_p = (pointer)0x0;
  sStack_1430 = 0;
  local_1428._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
             in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7e8,
             SUB41(in_stack_ffffffffffffe7e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7d0,
             (bool)in_stack_ffffffffffffe7cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_1458 = 0;
  aStack_1450._M_allocated_capacity = 0;
  aStack_1450._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
                 in_stack_ffffffffffffe7c0);
  std::operator+(in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
  local_14b1._57_8_ = 0;
  local_14b1._65_8_ = 0;
  local_14b1._73_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  this = (allocator<RPCResult> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
             in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7e8,
             SUB41(in_stack_ffffffffffffe7e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7df,in_stack_ffffffffffffe7d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7d0,
             (bool)in_stack_ffffffffffffe7cf);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe7c8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe7c0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe7cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b8,__l_00,
             (allocator_type *)in_stack_ffffffffffffe7b0);
  TransactionDescriptionString();
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7a8);
  this_01 = (RPCHelpMan *)local_14b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  name = (string *)&local_14b2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  local_14d9._1_8_ = (pointer)0x0;
  pRStack_14d0 = (pointer)0x0;
  local_14c8 = 0;
  description = (string *)(local_14d9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_14d9;
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe7c8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe7c0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe7cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b8,__l_01,
             (allocator_type *)in_stack_ffffffffffffe7b0);
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  results = (RPCResults *)(local_14db + 1);
  std::allocator<RPCResult>::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe7c8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe7c0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe7cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b8,__l_02,
             (allocator_type *)in_stack_ffffffffffffe7b0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7fc,
             (string *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
             in_stack_ffffffffffffe7e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
             (bool)in_stack_ffffffffffffe7df);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe7fc,in_stack_ffffffffffffe7f8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0));
  examples = (RPCExamples *)local_14db;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  HelpExampleCli(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  std::operator+((char *)in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  std::operator+(in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  HelpExampleCli(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  std::operator+(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  std::operator+(in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7cf,in_stack_ffffffffffffe7c8),
             (char *)in_stack_ffffffffffffe7c0,(allocator<char> *)in_stack_ffffffffffffe7b8);
  HelpExampleRpc(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  std::operator+(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0xccd342);
  this_00 = (RPCArg *)local_1500;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listtransactions()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffe788,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe780);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1500 + 0x20));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14df);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14de);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14dd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_14dc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_14db);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1778 = local_9a0;
  do {
    local_1778 = local_1778 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1778 != local_a28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1790 = local_1020;
  do {
    local_1790 = local_1790 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1790 != local_10a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_14b1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_17a8 = local_a68;
  do {
    local_17a8 = local_17a8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_17a8 != local_e20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_14b1 + 0x58));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_143a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1439);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1428 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1419);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe788);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1392);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1391);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1342);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1341);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1322);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1321);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe788);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_17c0 = local_48;
  do {
    local_17c0 = local_17c0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_17c0 != local_468);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1305 + 1));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1303);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1302);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1301);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_12e9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_12c9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listtransactions()
{
    return RPCHelpMan{"listtransactions",
                "\nIf a label name is provided, this will return only incoming transactions paying to addresses with the specified label.\n"
                "\nReturns up to 'count' most recent transactions skipping the first 'from' transactions.\n",
                {
                    {"label|dummy", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If set, should be a valid label name to return only incoming transactions\n"
                          "with the specified label, or \"*\" to disable filtering and return all transactions."},
                    {"count", RPCArg::Type::NUM, RPCArg::Default{10}, "The number of transactions to return"},
                    {"skip", RPCArg::Type::NUM, RPCArg::Default{0}, "The number of transactions to skip"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Include transactions to watch-only addresses (see 'importaddress')"},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                            {RPCResult::Type::STR, "address",  /*optional=*/true, "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."},
                            {RPCResult::Type::STR, "category", "The transaction category.\n"
                                "\"send\"                  Transactions sent.\n"
                                "\"receive\"               Non-coinbase transactions received.\n"
                                "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                "\"orphan\"                Orphaned coinbase transactions received."},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT + ". This is negative for the 'send' category, and is positive\n"
                                "for all other categories"},
                            {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                            {RPCResult::Type::NUM, "vout", "the vout value"},
                            {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                 "'send' category of transactions."},
                        },
                        TransactionDescriptionString()),
                        {
                            {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                        })},
                    }
                },
                RPCExamples{
            "\nList the most recent 10 transactions in the systems\n"
            + HelpExampleCli("listtransactions", "") +
            "\nList transactions 100 to 120\n"
            + HelpExampleCli("listtransactions", "\"*\" 20 100") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listtransactions", "\"*\", 20, 100")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    std::optional<std::string> filter_label;
    if (!request.params[0].isNull() && request.params[0].get_str() != "*") {
        filter_label.emplace(LabelFromValue(request.params[0]));
        if (filter_label.value().empty()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Label argument must be a valid label name or \"*\".");
        }
    }
    int nCount = 10;
    if (!request.params[1].isNull())
        nCount = request.params[1].getInt<int>();
    int nFrom = 0;
    if (!request.params[2].isNull())
        nFrom = request.params[2].getInt<int>();
    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[3], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    if (nCount < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative count");
    if (nFrom < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative from");

    std::vector<UniValue> ret;
    {
        LOCK(pwallet->cs_wallet);

        const CWallet::TxItems & txOrdered = pwallet->wtxOrdered;

        // iterate backwards until we have nCount items to return:
        for (CWallet::TxItems::const_reverse_iterator it = txOrdered.rbegin(); it != txOrdered.rend(); ++it)
        {
            CWalletTx *const pwtx = (*it).second;
            ListTransactions(*pwallet, *pwtx, 0, true, ret, filter, filter_label);
            if ((int)ret.size() >= (nCount+nFrom)) break;
        }
    }

    // ret is newest to oldest

    if (nFrom > (int)ret.size())
        nFrom = ret.size();
    if ((nFrom + nCount) > (int)ret.size())
        nCount = ret.size() - nFrom;

    auto txs_rev_it{std::make_move_iterator(ret.rend())};
    UniValue result{UniValue::VARR};
    result.push_backV(txs_rev_it - nFrom - nCount, txs_rev_it - nFrom); // Return oldest to newest
    return result;
},
    };
}